

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.hpp
# Opt level: O0

shared_ptr<helics::Broker> __thiscall
helics::BrokerFactory::
BrokerTypeBuilder<helics::NetworkBroker<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0,_6>_>
::build(BrokerTypeBuilder<helics::NetworkBroker<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0,_6>_>
        *this,string_view name)

{
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::Broker> *in_RDI;
  shared_ptr<helics::Broker> sVar1;
  shared_ptr<helics::NetworkBroker<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0,_6>_>
  *in_stack_ffffffffffffffb8;
  shared_ptr<helics::Broker> *this_00;
  
  this_00 = in_RDI;
  std::
  make_shared<helics::NetworkBroker<helics::tcp::TcpComms,(gmlc::networking::InterfaceTypes)0,6>,std::basic_string_view<char,std::char_traits<char>>&>
            (in_RDX);
  std::shared_ptr<helics::Broker>::
  shared_ptr<helics::NetworkBroker<helics::tcp::TcpComms,(gmlc::networking::InterfaceTypes)0,6>,void>
            (this_00,in_stack_ffffffffffffffb8);
  std::
  shared_ptr<helics::NetworkBroker<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0,_6>_>
  ::~shared_ptr((shared_ptr<helics::NetworkBroker<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0,_6>_>
                 *)0x459a6d);
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<helics::Broker>)
         sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<Broker> build(std::string_view name) override
        {
            return std::make_shared<BrokerTYPE>(name);
        }